

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

bool __thiscall Datetime::initializeSonq(Datetime *this,Pig *pig)

{
  size_type this_00;
  bool bVar1;
  tm *__tp;
  time_t tVar2;
  tm *t;
  time_t now;
  int following;
  allocator<char> local_49;
  string local_48;
  size_type local_28;
  size_type checkpoint;
  Pig *pig_local;
  Datetime *this_local;
  
  checkpoint = (size_type)pig;
  pig_local = (Pig *)this;
  local_28 = Pig::cursor(pig);
  this_00 = checkpoint;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"sonq",&local_49);
  bVar1 = Pig::skipLiteral((Pig *)this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    now._0_4_ = Pig::peek((Pig *)checkpoint);
    bVar1 = unicodeLatinAlpha((uint)now);
    if ((!bVar1) && (bVar1 = unicodeLatinDigit((uint)now), !bVar1)) {
      t = (tm *)time((time_t *)0x0);
      __tp = localtime((time_t *)&t);
      __tp->tm_mon = (3 - __tp->tm_mon % 3) + __tp->tm_mon;
      if (0xb < __tp->tm_mon) {
        __tp->tm_mon = __tp->tm_mon + -0xc;
        __tp->tm_year = __tp->tm_year + 1;
      }
      __tp->tm_sec = 0;
      __tp->tm_min = 0;
      __tp->tm_hour = 0;
      __tp->tm_mday = 1;
      __tp->tm_isdst = -1;
      tVar2 = mktime(__tp);
      this->_date = tVar2;
      return true;
    }
  }
  Pig::restoreTo((Pig *)checkpoint,local_28);
  return false;
}

Assistant:

bool Datetime::initializeSonq (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (pig.skipLiteral ("sonq"))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_mon += 3 - (t->tm_mon % 3);
      if (t->tm_mon > 11)
      {
        t->tm_mon -= 12;
        ++t->tm_year;
      }

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_mday = 1;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}